

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O2

void __thiscall
libtorrent::dht::observer::observer
          (observer *this,shared_ptr<libtorrent::dht::traversal_algorithm> *a,endpoint *ep,
          node_id *id)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 uVar3;
  
  (this->super_enable_shared_from_this<libtorrent::dht::observer>)._M_weak_this.
  super___weak_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<libtorrent::dht::observer>)._M_weak_this.
  super___weak_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_observer = (_func_int **)&PTR__observer_004d32d0;
  (this->m_sent).__d.__r = 0;
  (this->m_algorithm).
  super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (a->super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  p_Var2 = (a->super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>)
           ._M_refcount._M_pi;
  (a->super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_algorithm).
  super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->m_algorithm).
  super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  (a->super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (this->m_id).m_number._M_elems[4] = (id->m_number)._M_elems[4];
  uVar3 = *(undefined8 *)((id->m_number)._M_elems + 2);
  *(undefined8 *)(this->m_id).m_number._M_elems = *(undefined8 *)(id->m_number)._M_elems;
  *(undefined8 *)((this->m_id).m_number._M_elems + 2) = uVar3;
  this->m_port = 0;
  (this->flags).m_val = '\0';
  set_target(this,ep);
  return;
}

Assistant:

observer(std::shared_ptr<traversal_algorithm> a
		, udp::endpoint const& ep, node_id const& id)
		: m_algorithm(std::move(a))
		, m_id(id)
	{
		TORRENT_ASSERT(!m_was_sent);
		TORRENT_ASSERT(m_algorithm);
		set_target(ep);
	}